

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<double>_>::copy
          (TypedAttribute<Imath_2_5::Matrix33<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  Attribute *attribute;
  TypedAttribute<Imath_2_5::Matrix33<double>_> *in_stack_ffffffffffffffe0;
  
  plVar1 = (long *)operator_new(0x50);
  plVar1[8] = 0;
  plVar1[9] = 0;
  plVar1[6] = 0;
  plVar1[7] = 0;
  plVar1[4] = 0;
  plVar1[5] = 0;
  plVar1[2] = 0;
  plVar1[3] = 0;
  *plVar1 = 0;
  plVar1[1] = 0;
  TypedAttribute(in_stack_ffffffffffffffe0);
  (**(code **)(*plVar1 + 0x30))(plVar1,this);
  return (int)plVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}